

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::VerifyUTF8
          (EpsCopyInputStream *this,char *ptr,size_t size)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = BytesAvailable(this,ptr);
  if ((ulong)(long)iVar1 < size) {
    pcVar2 = VerifyUTF8Fallback(this,ptr,size);
    return pcVar2;
  }
  iVar1 = utf8_range_IsValid(ptr,size);
  pcVar2 = (char *)0x0;
  if (iVar1 != 0) {
    pcVar2 = ptr + size;
  }
  return pcVar2;
}

Assistant:

const char* EpsCopyInputStream::VerifyUTF8(const char* ptr, size_t size) {
  if (size <= static_cast<size_t>(BytesAvailable(ptr))) {
    return utf8_range::IsStructurallyValid({ptr, size}) ? ptr + size : nullptr;
  }
  return VerifyUTF8Fallback(ptr, size);
}